

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O3

bool __thiscall GenericModel::setFlags(GenericModel *this,QModelIndex *index,ItemFlags flags)

{
  bool bVar1;
  bool bVar2;
  
  bVar2 = -1 < (index->c | index->r);
  bVar1 = index->m != (QAbstractItemModel *)0x0;
  if ((bVar1 && bVar2) && (*(Int *)(index->i + 0x18) != flags.i)) {
    *(Int *)(index->i + 0x18) = flags.i;
    QAbstractItemModel::dataChanged((QModelIndex *)this,index,(QList *)index);
  }
  return bVar1 && bVar2;
}

Assistant:

bool GenericModel::setFlags(const QModelIndex &index, Qt::ItemFlags flags)
{
    if (!index.isValid())
        return false;
    Q_ASSERT(index.model() == this);
    Q_D(GenericModel);
    GenericModelItem *const item = d->itemForIndex(index);
    if (item->flags != flags) {
        item->flags = flags;
        dataChanged(index, index);
    }
    return true;
}